

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_vector.h
# Opt level: O0

void crnlib::
     vector<crnlib::hash_map<unsigned_long_long,_crnlib::empty_type,_crnlib::hasher<unsigned_long_long>,_crnlib::equal_to<unsigned_long_long>_>::raw_node>
     ::object_mover(void *pDst_void,void *pSrc_void,uint num)

{
  uint in_EDX;
  raw_node *in_RSI;
  raw_node *in_RDI;
  raw_node *pDst;
  raw_node *pSrc_end;
  raw_node *pSrc;
  raw_node *other;
  
  other = in_RSI + in_EDX;
  for (; in_RSI != other; in_RSI = in_RSI + 1) {
    hash_map<unsigned_long_long,_crnlib::empty_type,_crnlib::hasher<unsigned_long_long>,_crnlib::equal_to<unsigned_long_long>_>
    ::raw_node::raw_node(in_RSI,other);
    hash_map<unsigned_long_long,_crnlib::empty_type,_crnlib::hasher<unsigned_long_long>,_crnlib::equal_to<unsigned_long_long>_>
    ::raw_node::~raw_node(in_RDI);
    in_RDI = in_RDI + 1;
  }
  return;
}

Assistant:

static void object_mover(void* pDst_void, void* pSrc_void, uint num) {
    T* pSrc = static_cast<T*>(pSrc_void);
    T* const pSrc_end = pSrc + num;
    T* pDst = static_cast<T*>(pDst_void);

    while (pSrc != pSrc_end) {
      // placement new
      new (static_cast<void*>(pDst)) T(*pSrc);
      pSrc->~T();
      ++pSrc;
      ++pDst;
    }
  }